

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O0

size_t __thiscall
Diligent::DeviceContextVkImpl::GetDynamicBufferOffset
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffer,bool VerifyAllocation)

{
  Char *pCVar1;
  VkBuffer_T *pVVar2;
  BufferDesc *Args;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  char (*in_RCX) [19];
  char (*in_R8) [34];
  DeviceContextVkImpl *local_a0;
  undefined1 local_78 [8];
  string msg_1;
  Uint32 DynamicBufferId;
  undefined1 local_48 [8];
  string msg;
  bool VerifyAllocation_local;
  BufferVkImpl *pBuffer_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._M_local_buf[0xf] = VerifyAllocation;
  if (pBuffer == (BufferVkImpl *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xc2897a,
               in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x295);
    std::__cxx11::string::~string((string *)local_48);
  }
  pVVar2 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&pBuffer->m_VulkanBuffer);
  if (pVVar2 == (VkBuffer_T *)0x0) {
    if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
      DvpVerifyDynamicAllocation(this,pBuffer);
    }
    msg_1.field_2._8_4_ =
         BufferBase<Diligent::EngineVkImplTraits>::GetDynamicBufferId
                   (&pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>);
    if (msg_1.field_2._8_4_ == 0xffffffff) {
      Args = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)pBuffer);
      FormatString<char[17],char_const*,char[34]>
                ((string *)local_78,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                 (char **)"\' does not have dynamic buffer ID",in_R8);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"GetDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                 ,0x2a2);
      std::__cxx11::string::~string((string *)local_78);
    }
    uVar3 = (ulong)(uint)msg_1.field_2._8_4_;
    sVar4 = std::
            vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
            ::size(&this->m_MappedBuffers);
    if (uVar3 < sVar4) {
      pvVar5 = std::
               vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               ::operator[](&this->m_MappedBuffers,(ulong)(uint)msg_1.field_2._8_4_);
      local_a0 = (DeviceContextVkImpl *)(pvVar5->Allocation).AlignedOffset;
    }
    else {
      local_a0 = (DeviceContextVkImpl *)0x0;
    }
    this_local = local_a0;
  }
  else {
    this_local = (DeviceContextVkImpl *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

__forceinline size_t DeviceContextVkImpl::GetDynamicBufferOffset(const BufferVkImpl* pBuffer, bool VerifyAllocation)
{
    VERIFY_EXPR(pBuffer != nullptr);

    if (pBuffer->m_VulkanBuffer != VK_NULL_HANDLE)
        return 0;

#ifdef DILIGENT_DEVELOPMENT
    if (VerifyAllocation)
    {
        DvpVerifyDynamicAllocation(pBuffer);
    }
#endif

    const Uint32 DynamicBufferId = pBuffer->GetDynamicBufferId();
    VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", pBuffer->GetDesc().Name, "' does not have dynamic buffer ID");
    return DynamicBufferId < m_MappedBuffers.size() ?
        m_MappedBuffers[DynamicBufferId].Allocation.AlignedOffset :
        0;
}